

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontNonSym.cpp
# Opt level: O3

void __thiscall
TPZFrontNonSym<std::complex<float>_>::AddKel
          (TPZFrontNonSym<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *elmat,
          TPZVec<long> *destinationindex)

{
  _ComplexT _Var1;
  _ComplexT _Var2;
  long lVar3;
  long lVar4;
  complex<float> *pcVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  lVar3 = destinationindex->fNElements;
  if (0 < lVar3) {
    lVar9 = 0;
    do {
      iVar6 = Local(this,destinationindex->fStore[lVar9]);
      lVar10 = 0;
      do {
        iVar7 = Local(this,destinationindex->fStore[lVar10]);
        lVar4 = (elmat->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
        if ((lVar4 <= lVar9) ||
           ((elmat->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <= lVar10)) {
          TPZFMatrix<std::complex<float>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar8 = (long)(this->super_TPZFront<std::complex<float>_>).fMaxFront * (long)iVar7;
        pcVar5 = (this->super_TPZFront<std::complex<float>_>).fData.fStore;
        _Var1 = elmat->fElem[lVar4 * lVar10 + lVar9]._M_value;
        _Var2 = pcVar5[lVar8 + iVar6]._M_value;
        pcVar5[lVar8 + iVar6]._M_value =
             CONCAT44((float)(_Var2 >> 0x20) + (float)(_Var1 >> 0x20),(float)_Var2 + (float)_Var1);
        lVar10 = lVar10 + 1;
      } while (lVar3 != lVar10);
      lVar9 = lVar9 + 1;
    } while (lVar9 != lVar3);
  }
  return;
}

Assistant:

void TPZFrontNonSym<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &destinationindex)
{
    int64_t i, j, ilocal, jlocal, nel;
    nel = destinationindex.NElements();
    for(i=0;i<nel;i++){
        ilocal = this->Local(destinationindex[i]);
		for(j=0;j<nel;j++) {
            jlocal=this->Local(destinationindex[j]);
            this->Element(ilocal, jlocal)+=elmat(i,j);
        }
    }
}